

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slhdsa_test.cc
# Opt level: O3

void anon_unknown.dwarf_9e2389::NISTSignatureGenerationFileTest(FileTest *t)

{
  uint8_t *puVar1;
  bool bVar2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  char *pcVar3;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f70;
  Bytes local_1f68;
  Bytes local_1f58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> priv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_sig;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg;
  uint8_t sig [7856];
  
  priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expected_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expected_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expected_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = sig + 0x10;
  sig._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)sig,"priv","");
  bVar2 = FileTest::GetBytes(t,&priv,(string *)sig);
  local_1f78._M_head_impl._0_1_ = (internal)bVar2;
  local_1f70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((uint8_t *)sig._0_8_ == puVar1) {
    if (!bVar2) goto LAB_0036b4c5;
LAB_0036b1c9:
    if (local_1f70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1f70,local_1f70);
    }
    local_1f78._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish +
         -(long)priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start);
    local_1f68.span_.data_ = (uchar *)0x40;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)sig,"priv.size()","static_cast<size_t>(64)",(unsigned_long *)&local_1f78,
               (unsigned_long *)&local_1f68);
    if (sig[0] == '\0') {
      testing::Message::Message((Message *)&local_1f78);
      if (sig._8_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)sig._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1f68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x93,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f68,(Message *)&local_1f78)
      ;
    }
    else {
      if (sig._8_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(sig + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sig._8_8_)
        ;
      }
      sig._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)sig,"entropy","");
      bVar2 = FileTest::GetBytes(t,&entropy,(string *)sig);
      local_1f78._M_head_impl._0_1_ = (internal)bVar2;
      local_1f70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((uint8_t *)sig._0_8_ == puVar1) {
        if (!bVar2) {
LAB_0036b666:
          testing::Message::Message((Message *)&local_1f68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)sig,(internal *)&local_1f78,
                     (AssertionResult *)"t->GetBytes(&entropy, \"entropy\")","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1f58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                     ,0x94,(char *)sig._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1f58,(Message *)&local_1f68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f58);
          if ((uint8_t *)sig._0_8_ != puVar1) {
            operator_delete((void *)sig._0_8_,sig._16_8_ + 1);
          }
          sig._8_8_ = local_1f70;
          if ((long *)local_1f68.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_1f68.span_.data_ + 8))();
            sig._8_8_ = local_1f70;
          }
          goto joined_r0x0036b807;
        }
      }
      else {
        operator_delete((void *)sig._0_8_,sig._16_8_ + 1);
        if (((ulong)local_1f78._M_head_impl & 1) == 0) goto LAB_0036b666;
      }
      if (local_1f70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1f70,local_1f70);
      }
      local_1f78._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish +
           -(long)entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      local_1f68.span_.data_ = (uchar *)0x10;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)sig,"entropy.size()","static_cast<size_t>(16)",
                 (unsigned_long *)&local_1f78,(unsigned_long *)&local_1f68);
      if (sig[0] != '\0') {
        if (sig._8_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(sig + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       sig._8_8_);
        }
        sig._0_8_ = puVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)sig,"msg","");
        bVar2 = FileTest::GetBytes(t,&msg,(string *)sig);
        local_1f78._M_head_impl._0_1_ = (internal)bVar2;
        local_1f70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((uint8_t *)sig._0_8_ == puVar1) {
          if (!bVar2) goto LAB_0036b767;
        }
        else {
          operator_delete((void *)sig._0_8_,sig._16_8_ + 1);
          if (((ulong)local_1f78._M_head_impl & 1) == 0) {
LAB_0036b767:
            testing::Message::Message((Message *)&local_1f68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)sig,(internal *)&local_1f78,
                       (AssertionResult *)"t->GetBytes(&msg, \"msg\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1f58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                       ,0x96,(char *)sig._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1f58,(Message *)&local_1f68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f58);
            if ((uint8_t *)sig._0_8_ != puVar1) {
              operator_delete((void *)sig._0_8_,sig._16_8_ + 1);
            }
            sig._8_8_ = local_1f70;
            if ((long *)local_1f68.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_1f68.span_.data_ + 8))();
              sig._8_8_ = local_1f70;
            }
            goto joined_r0x0036b807;
          }
        }
        if (local_1f70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1f70,local_1f70);
        }
        sig._0_8_ = puVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)sig,"sig","");
        bVar2 = FileTest::GetBytes(t,&expected_sig,(string *)sig);
        local_1f78._M_head_impl._0_1_ = (internal)bVar2;
        local_1f70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((uint8_t *)sig._0_8_ == puVar1) {
          if (bVar2) goto LAB_0036b40a;
LAB_0036b81a:
          testing::Message::Message((Message *)&local_1f68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)sig,(internal *)&local_1f78,
                     (AssertionResult *)"t->GetBytes(&expected_sig, \"sig\")","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1f58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                     ,0x97,(char *)sig._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1f58,(Message *)&local_1f68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f58);
          if ((uint8_t *)sig._0_8_ != puVar1) {
            operator_delete((void *)sig._0_8_,sig._16_8_ + 1);
          }
          sig._8_8_ = local_1f70;
          if ((long *)local_1f68.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_1f68.span_.data_ + 8))();
            sig._8_8_ = local_1f70;
          }
          goto joined_r0x0036b807;
        }
        operator_delete((void *)sig._0_8_,sig._16_8_ + 1);
        if (((ulong)local_1f78._M_head_impl & 1) == 0) goto LAB_0036b81a;
LAB_0036b40a:
        if (local_1f70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1f70,local_1f70);
        }
        BCM_slhdsa_sha2_128s_sign_internal
                  (sig,priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,(uint8_t *)0x0,(uint8_t *)0x0,0,
                   msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start);
        local_1f68.span_.size_ = (size_t)&DAT_00001eb0;
        local_1f58.span_.size_ =
             (long)expected_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)expected_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_1f58.span_.data_ =
             expected_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1f68.span_.data_ = sig;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)&local_1f78,"Bytes(sig)","Bytes(expected_sig)",&local_1f68,
                   &local_1f58);
        if (local_1f78._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_1f68);
          if (local_1f70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            message = "";
          }
          else {
            message = (local_1f70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1f58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                     ,0x9d,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1f58,(Message *)&local_1f68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f58);
          if ((long *)local_1f68.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_1f68.span_.data_ + 8))();
          }
        }
        if (local_1f70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_0036b5ec;
        this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1f70;
        sig._8_8_ = local_1f70;
        goto LAB_0036b5e7;
      }
      testing::Message::Message((Message *)&local_1f78);
      if (sig._8_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)sig._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1f68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x95,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f68,(Message *)&local_1f78)
      ;
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f68);
    if (local_1f78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f78._M_head_impl + 8))();
    }
    if (sig._8_8_ == 0) goto LAB_0036b5ec;
    this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(sig + 8);
  }
  else {
    operator_delete((void *)sig._0_8_,sig._16_8_ + 1);
    if (((ulong)local_1f78._M_head_impl & 1) != 0) goto LAB_0036b1c9;
LAB_0036b4c5:
    testing::Message::Message((Message *)&local_1f68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)sig,(internal *)&local_1f78,
               (AssertionResult *)"t->GetBytes(&priv, \"priv\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
               ,0x91,(char *)sig._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f58,(Message *)&local_1f68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f58);
    if ((uint8_t *)sig._0_8_ != puVar1) {
      operator_delete((void *)sig._0_8_,sig._16_8_ + 1);
    }
    sig._8_8_ = local_1f70;
    if ((long *)local_1f68.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_1f68.span_.data_ + 8))();
      sig._8_8_ = local_1f70;
    }
joined_r0x0036b807:
    local_1f70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sig._8_8_;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sig._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_0036b5ec;
    this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_1f70;
  }
LAB_0036b5e7:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sig._8_8_);
LAB_0036b5ec:
  if (expected_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(expected_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)expected_sig.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)expected_sig.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void NISTSignatureGenerationFileTest(FileTest *t) {
  std::vector<uint8_t> priv, entropy, msg, expected_sig;
  ASSERT_TRUE(t->GetBytes(&priv, "priv"));
  ASSERT_EQ(priv.size(),
            static_cast<size_t>(SLHDSA_SHA2_128S_PRIVATE_KEY_BYTES));
  ASSERT_TRUE(t->GetBytes(&entropy, "entropy"));
  ASSERT_EQ(entropy.size(), static_cast<size_t>(BCM_SLHDSA_SHA2_128S_N));
  ASSERT_TRUE(t->GetBytes(&msg, "msg"));
  ASSERT_TRUE(t->GetBytes(&expected_sig, "sig"));

  uint8_t sig[SLHDSA_SHA2_128S_SIGNATURE_BYTES];
  BCM_slhdsa_sha2_128s_sign_internal(sig, priv.data(), nullptr, nullptr, 0,
                                     msg.data(), msg.size(), entropy.data());

  EXPECT_EQ(Bytes(sig), Bytes(expected_sig));
}